

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

HRESULT __thiscall
Js::SourceTextModuleRecord::ResolveExternalModuleDependencies(SourceTextModuleRecord *this)

{
  anon_class_24_3_248f5e5f fn;
  char16 *pcVar1;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> **ppSVar2;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  void **ppvVar3;
  JavascriptLibrary *this_01;
  JavascriptError *pError;
  JavascriptError *error;
  HRESULT local_1c;
  ScriptContext *pSStack_18;
  HRESULT hr;
  ScriptContext *scriptContext;
  SourceTextModuleRecord *this_local;
  
  scriptContext = (ScriptContext *)this;
  pcVar1 = GetSpecifierSz(this);
  Output::TraceWithFlush(ModulePhase,L"ResolveExternalModuleDependencies(%s)\n",pcVar1);
  pSStack_18 = GetScriptContext(this);
  local_1c = 0;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                      ((WriteBarrierPtr *)&this->requestedModuleList);
  if (*ppSVar2 != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    EnsureChildModuleSet(this,pSStack_18);
    this_00 = Memory::WriteBarrierPtr<SList<Ident_*,_Memory::ArenaAllocator,_RealCount>_>::
              operator->(&this->requestedModuleList);
    fn.hr = &local_1c;
    fn.this = this;
    fn.scriptContext = &stack0xffffffffffffffe8;
    SListBase<Ident*,Memory::ArenaAllocator,RealCount>::
    MapUntil<Js::SourceTextModuleRecord::ResolveExternalModuleDependencies()::__0>
              ((SListBase<Ident*,Memory::ArenaAllocator,RealCount> *)this_00,fn);
    if (local_1c < 0) {
      ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&this->errorObject);
      if (*ppvVar3 == (void *)0x0) {
        this_01 = ScriptContext::GetLibrary(pSStack_18);
        pError = JavascriptLibrary::CreateError(this_01);
        JavascriptError::SetErrorMessageProperties
                  (pError,local_1c,L"fetch import module failed",pSStack_18);
        Memory::WriteBarrierPtr<void>::operator=(&this->errorObject,pError);
      }
      Output::TraceWithFlush(ModulePhase,L"\tfetch import module failed\n");
      NotifyParentsAsNeeded(this);
    }
  }
  return local_1c;
}

Assistant:

HRESULT SourceTextModuleRecord::ResolveExternalModuleDependencies()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ResolveExternalModuleDependencies(%s)\n"), this->GetSpecifierSz());

        ScriptContext* scriptContext = GetScriptContext();

        HRESULT hr = NOERROR;
        if (requestedModuleList != nullptr)
        {
            EnsureChildModuleSet(scriptContext);

            requestedModuleList->MapUntil([&](IdentPtr specifier) {
                LPCOLESTR moduleName = specifier->Psz();
                ModuleRecordBase* moduleRecordBase = nullptr;
                SourceTextModuleRecord* moduleRecord = nullptr;
                bool itemFound = childrenModuleSet->TryGetValue(moduleName, &moduleRecord);
                if (!itemFound)
                {
                    hr = scriptContext->GetHostScriptContext()->FetchImportedModule(this, moduleName, &moduleRecordBase);
                    if (FAILED(hr))
                    {
                        return true;
                    }
                    moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);
                    Var errorObject = moduleRecord->GetErrorObject();
                    if (errorObject == nullptr)
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>SetParent in (%s)\n"), moduleRecord->GetSpecifierSz());
                        moduleRecord->SetParent(this, moduleName);
                    }
                    else
                    {
                        this->errorObject = errorObject;
                        hr = E_FAIL;
                        return true;
                    }
                }
                return false;
            });

            if (FAILED(hr))
            {
                if (this->errorObject == nullptr)
                {
                    JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                    JavascriptError::SetErrorMessageProperties(error, hr, _u("fetch import module failed"), scriptContext);
                    this->errorObject = error;
                }

                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\tfetch import module failed\n"));
                NotifyParentsAsNeeded();
            }
        }
        return hr;
    }